

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_genericmodel.cpp
# Opt level: O0

void __thiscall tst_GenericModel::moveColumnsTreeSameBranch(tst_GenericModel *this)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  const_reference pQVar4;
  QModelIndex local_2398;
  QModelIndex local_2380;
  undefined1 local_2368 [8];
  value_type args_3;
  qsizetype local_2348;
  QSignalSpy *local_2340;
  QSignalSpy *spy_9;
  QSignalSpy **__end1_9;
  QSignalSpy **__begin1_9;
  QSignalSpy *(*__range1_9) [2];
  QString local_2308;
  QVariant local_22f0;
  QString local_22d0;
  QArrayDataPointer<char16_t> local_22b8;
  QString local_22a0;
  QModelIndex local_2288;
  QVariant local_2270;
  QString local_2250;
  QArrayDataPointer<char16_t> local_2238;
  QString local_2220;
  QModelIndex local_2208;
  QVariant local_21f0;
  QString local_21d0;
  QArrayDataPointer<char16_t> local_21b8;
  QString local_21a0;
  QModelIndex local_2188;
  QVariant local_2170;
  QString local_2150;
  QArrayDataPointer<char16_t> local_2138;
  QString local_2120;
  QModelIndex local_2108;
  QVariant local_20f0;
  QString local_20d0;
  QArrayDataPointer<char16_t> local_20b8;
  QString local_20a0;
  QModelIndex local_2088;
  QVariant local_2070;
  QString local_2050;
  QArrayDataPointer<char16_t> local_2038;
  QString local_2020;
  QModelIndex local_2008;
  QVariant local_1ff0;
  QString local_1fd0;
  QArrayDataPointer<char16_t> local_1fb8;
  QString local_1fa0;
  QModelIndex local_1f88;
  QVariant local_1f70;
  QString local_1f50;
  QArrayDataPointer<char16_t> local_1f38;
  QString local_1f20;
  QModelIndex local_1f08;
  QVariant local_1ef0;
  QString local_1ed0;
  QArrayDataPointer<char16_t> local_1eb8;
  QString local_1ea0;
  QModelIndex local_1e88;
  QVariant local_1e70;
  QString local_1e50;
  QArrayDataPointer<char16_t> local_1e38;
  QString local_1e20;
  QModelIndex local_1e08;
  QVariant local_1df0;
  QString local_1dd0;
  QArrayDataPointer<char16_t> local_1db8;
  QString local_1da0;
  QModelIndex local_1d88;
  QVariant local_1d70;
  QString local_1d50;
  QArrayDataPointer<char16_t> local_1d38;
  QString local_1d20;
  QModelIndex local_1d08;
  QVariant local_1cf0;
  QString local_1cd0;
  undefined1 local_1cb8 [24];
  QPersistentModelIndex local_1ca0 [8];
  QPersistentModelIndex oneOneIndex;
  QModelIndex local_1c80;
  undefined1 local_1c68 [8];
  value_type args_2;
  qsizetype local_1c48;
  QSignalSpy *local_1c40;
  QSignalSpy *spy_8;
  QSignalSpy **__end1_8;
  QSignalSpy **__begin1_8;
  QSignalSpy *(*__range1_8) [2];
  QString local_1c08;
  QVariant local_1bf0;
  QString local_1bd0;
  QArrayDataPointer<char16_t> local_1bb8;
  QString local_1ba0;
  QModelIndex local_1b88;
  QVariant local_1b70;
  QString local_1b50;
  QArrayDataPointer<char16_t> local_1b38;
  QString local_1b20;
  QModelIndex local_1b08;
  QVariant local_1af0;
  QString local_1ad0;
  QArrayDataPointer<char16_t> local_1ab8;
  QString local_1aa0;
  QModelIndex local_1a88;
  QVariant local_1a70;
  QString local_1a50;
  QArrayDataPointer<char16_t> local_1a38;
  QString local_1a20;
  QModelIndex local_1a08;
  QVariant local_19f0;
  QString local_19d0;
  QArrayDataPointer<char16_t> local_19b8;
  QString local_19a0;
  QModelIndex local_1988;
  QVariant local_1970;
  QString local_1950;
  QArrayDataPointer<char16_t> local_1938;
  QString local_1920;
  QModelIndex local_1908;
  QVariant local_18f0;
  QString local_18d0;
  QArrayDataPointer<char16_t> local_18b8;
  QString local_18a0;
  QModelIndex local_1888;
  QVariant local_1870;
  QString local_1850;
  QArrayDataPointer<char16_t> local_1838;
  QString local_1820;
  QModelIndex local_1808;
  QVariant local_17f0;
  QString local_17d0;
  QArrayDataPointer<char16_t> local_17b8;
  QString local_17a0;
  QModelIndex local_1788;
  QVariant local_1770;
  QString local_1750;
  QArrayDataPointer<char16_t> local_1738;
  QString local_1720;
  QModelIndex local_1708;
  QVariant local_16f0;
  QString local_16d0;
  QArrayDataPointer<char16_t> local_16b8;
  QString local_16a0;
  QModelIndex local_1688;
  QVariant local_1670;
  QString local_1650;
  QArrayDataPointer<char16_t> local_1638;
  QString local_1620;
  QModelIndex local_1608;
  QVariant local_15f0;
  QString local_15d0;
  undefined1 local_15b8 [24];
  QModelIndex local_15a0;
  QModelIndex local_1588;
  undefined1 local_1570 [8];
  value_type args_1;
  qsizetype local_1550;
  QSignalSpy *local_1548;
  QSignalSpy *spy_7;
  QSignalSpy **__end1_7;
  QSignalSpy **__begin1_7;
  QSignalSpy *(*__range1_7) [2];
  QString local_1510;
  QVariant local_14f8;
  QString local_14d8;
  QArrayDataPointer<char16_t> local_14c0;
  QString local_14a8;
  QModelIndex local_1490;
  QVariant local_1478;
  QString local_1458;
  QArrayDataPointer<char16_t> local_1440;
  QString local_1428;
  QModelIndex local_1410;
  QVariant local_13f8;
  QString local_13d8;
  QArrayDataPointer<char16_t> local_13c0;
  QString local_13a8;
  QModelIndex local_1390;
  QVariant local_1378;
  QString local_1358;
  QArrayDataPointer<char16_t> local_1340;
  QString local_1328;
  QModelIndex local_1310;
  QVariant local_12f8;
  QString local_12d8;
  QArrayDataPointer<char16_t> local_12c0;
  QString local_12a8;
  QModelIndex local_1290;
  QVariant local_1278;
  QString local_1258;
  QArrayDataPointer<char16_t> local_1240;
  QString local_1228;
  QModelIndex local_1210;
  QVariant local_11f8;
  QString local_11d8;
  QArrayDataPointer<char16_t> local_11c0;
  QString local_11a8;
  QModelIndex local_1190;
  QVariant local_1178;
  QString local_1158;
  QArrayDataPointer<char16_t> local_1140;
  QString local_1128;
  QModelIndex local_1110;
  QVariant local_10f8;
  QString local_10d8;
  QArrayDataPointer<char16_t> local_10c0;
  QString local_10a8;
  QModelIndex local_1090;
  QVariant local_1078;
  QString local_1058;
  QArrayDataPointer<char16_t> local_1040;
  QString local_1028;
  QModelIndex local_1010;
  QVariant local_ff8;
  QString local_fd8;
  QArrayDataPointer<char16_t> local_fc0;
  QString local_fa8;
  QModelIndex local_f90;
  QVariant local_f78;
  QString local_f58;
  QArrayDataPointer<char16_t> local_f40;
  QString local_f28;
  QModelIndex local_f10;
  QVariant local_ef8;
  QString local_ed8;
  undefined1 local_ec0 [24];
  QModelIndex local_ea8;
  QModelIndex local_e90;
  undefined1 local_e78 [8];
  value_type args;
  qsizetype local_e58;
  QSignalSpy *local_e50;
  QSignalSpy *spy_6;
  QSignalSpy **__end1_6;
  QSignalSpy **__begin1_6;
  QSignalSpy *(*__range1_6) [2];
  QString local_e18;
  QVariant local_e00;
  QString local_de0;
  QArrayDataPointer<char16_t> local_dc8;
  QString local_db0;
  QModelIndex local_d98;
  QVariant local_d80;
  QString local_d60;
  QArrayDataPointer<char16_t> local_d48;
  QString local_d30;
  QModelIndex local_d18;
  QVariant local_d00;
  QString local_ce0;
  QArrayDataPointer<char16_t> local_cc8;
  QString local_cb0;
  QModelIndex local_c98;
  QVariant local_c80;
  QString local_c60;
  QArrayDataPointer<char16_t> local_c48;
  QString local_c30;
  QModelIndex local_c18;
  QVariant local_c00;
  QString local_be0;
  QArrayDataPointer<char16_t> local_bc8;
  QString local_bb0;
  QModelIndex local_b98;
  QVariant local_b80;
  QString local_b60;
  QArrayDataPointer<char16_t> local_b48;
  QString local_b30;
  QModelIndex local_b18;
  QVariant local_b00;
  QString local_ae0;
  QArrayDataPointer<char16_t> local_ac8;
  QString local_ab0;
  QModelIndex local_a98;
  QVariant local_a80;
  QString local_a60;
  QArrayDataPointer<char16_t> local_a48;
  QString local_a30;
  QModelIndex local_a18;
  QVariant local_a00;
  QString local_9e0;
  QArrayDataPointer<char16_t> local_9c8;
  QString local_9b0;
  QModelIndex local_998;
  QVariant local_980;
  QString local_960;
  QArrayDataPointer<char16_t> local_948;
  QString local_930;
  QModelIndex local_918;
  QVariant local_900;
  QString local_8e0;
  QArrayDataPointer<char16_t> local_8c8;
  QString local_8b0;
  QModelIndex local_898;
  QVariant local_880;
  QString local_860;
  QArrayDataPointer<char16_t> local_848;
  QString local_830;
  QModelIndex local_818;
  QVariant local_800;
  QString local_7e0;
  undefined1 local_7c8 [24];
  QPersistentModelIndex local_7b0 [8];
  QPersistentModelIndex oneTwoIndex;
  qint32 local_7a4;
  qsizetype local_7a0;
  QSignalSpy *local_798;
  QSignalSpy *spy_5;
  QSignalSpy **__end1_5;
  QSignalSpy **__begin1_5;
  QSignalSpy *(*__range1_5) [2];
  qsizetype local_770;
  QSignalSpy *local_768;
  QSignalSpy *spy_4;
  QSignalSpy **__end1_4;
  QSignalSpy **__begin1_4;
  QSignalSpy *(*__range1_4) [2];
  qsizetype local_740;
  QSignalSpy *local_738;
  QSignalSpy *spy_3;
  QSignalSpy **__end1_3;
  QSignalSpy **__begin1_3;
  QSignalSpy *(*__range1_3) [2];
  qsizetype local_710;
  QSignalSpy *local_708;
  QSignalSpy *spy_2;
  QSignalSpy **__end1_2;
  QSignalSpy **__begin1_2;
  QSignalSpy *(*__range1_2) [2];
  qsizetype local_6e0;
  QSignalSpy *local_6d8;
  QSignalSpy *spy_1;
  QSignalSpy **__end1_1;
  QSignalSpy **__begin1_1;
  QSignalSpy *(*__range1_1) [2];
  qsizetype local_6b0;
  QSignalSpy *local_6a8;
  QSignalSpy *spy;
  QSignalSpy **__end1;
  QSignalSpy **__begin1;
  QSignalSpy *(*__range1) [2];
  QSignalSpy *spyArr [2];
  QSignalSpy columnsMovedSpy;
  undefined1 local_5f0 [8];
  QSignalSpy rowsAboutToBeMovedSpy;
  undefined1 local_558 [8];
  QModelIndex parIndex;
  undefined1 local_518 [8];
  ModelTest probe;
  GenericModel testModel;
  tst_GenericModel *this_local;
  char16_t *str_51;
  char16_t *str_50;
  char16_t *str_49;
  char16_t *str_48;
  char16_t *str_47;
  char16_t *str_46;
  char16_t *str_45;
  char16_t *str_44;
  char16_t *str_43;
  char16_t *str_42;
  char16_t *str_41;
  char16_t *str_40;
  char16_t *str_39;
  char16_t *str_38;
  char16_t *str_37;
  char16_t *str_36;
  char16_t *str_35;
  char16_t *str_34;
  char16_t *str_33;
  char16_t *str_32;
  char16_t *str_31;
  char16_t *str_30;
  char16_t *str_29;
  char16_t *str_28;
  char16_t *str_27;
  char16_t *str_26;
  char16_t *str_25;
  char16_t *str_24;
  char16_t *str_23;
  char16_t *str_22;
  char16_t *str_21;
  char16_t *str_20;
  char16_t *str_19;
  char16_t *str_18;
  char16_t *str_17;
  char16_t *str_16;
  char16_t *str_15;
  char16_t *str_14;
  char16_t *str_13;
  char16_t *str_12;
  char16_t *str_11;
  char16_t *str_10;
  char16_t *str_9;
  char16_t *str_8;
  char16_t *str_7;
  char16_t *str_6;
  char16_t *str_5;
  char16_t *str_4;
  char16_t *str_3;
  char16_t *str_2;
  char16_t *str_1;
  char16_t *str;
  
  GenericModel::GenericModel((GenericModel *)&probe.field_0x8,(QObject *)0x0);
  ModelTest::ModelTest((ModelTest *)local_518,(QAbstractItemModel *)&probe.field_0x8,(QObject *)0x0)
  ;
  QModelIndex::QModelIndex((QModelIndex *)&parIndex.m);
  fillTable(this,(QAbstractItemModel *)&probe.field_0x8,2,6,(QModelIndex *)&parIndex.m,0);
  QModelIndex::QModelIndex((QModelIndex *)&rowsAboutToBeMovedSpy.m_waiting);
  GenericModel::index((int)local_558,(int)&probe + 8,(QModelIndex *)0x1);
  fillTable(this,(QAbstractItemModel *)&probe.field_0x8,2,6,(QModelIndex *)local_558,0);
  QSignalSpy::QSignalSpy
            ((QSignalSpy *)local_5f0,(QObject *)&probe.field_0x8,
             "2columnsAboutToBeMoved(QModelIndex, int, int, QModelIndex, int)");
  bVar1 = QSignalSpy::isValid((QSignalSpy *)local_5f0);
  bVar2 = QTest::qVerify(bVar1,"rowsAboutToBeMovedSpy.isValid()","",
                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                         ,0x883);
  if ((bVar2 & 1) != 0) {
    QSignalSpy::QSignalSpy
              ((QSignalSpy *)(spyArr + 1),(QObject *)&probe.field_0x8,
               "2columnsMoved(QModelIndex, int, int, QModelIndex, int)");
    bVar1 = QSignalSpy::isValid((QSignalSpy *)(spyArr + 1));
    bVar2 = QTest::qVerify(bVar1,"columnsMovedSpy.isValid()","",
                           "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                           ,0x885);
    if ((bVar2 & 1) != 0) {
      __range1 = (QSignalSpy *(*) [2])local_5f0;
      spyArr[0] = (QSignalSpy *)(spyArr + 1);
      bVar2 = GenericModel::moveColumns
                        ((QModelIndex *)&probe.field_0x8,(int)local_558,2,(QModelIndex *)0x1,
                         (int)local_558);
      bVar2 = QTest::qVerify((bool)(~bVar2 & 1),
                             "!testModel.moveColumns(parIndex, 2, 1, parIndex, -1)","",
                             "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                             ,0x888);
      if ((bVar2 & 1) != 0) {
        spy = (QSignalSpy *)(spyArr + 1);
        __end1 = (QSignalSpy **)&__range1;
        __begin1 = __end1;
        for (; (QSignalSpy *)__end1 != spy; __end1 = __end1 + 1) {
          local_6a8 = *__end1;
          local_6b0 = QList<QList<QVariant>_>::count(&local_6a8->super_QList<QList<QVariant>_>);
          __range1_1._4_4_ = 0;
          bVar1 = QTest::qCompare<long_long,int>
                            (&local_6b0,(qint32 *)((long)&__range1_1 + 4),"spy->count()","0",
                             "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                             ,0x88a);
          if (((bVar1 ^ 0xffU) & 1) != 0) goto LAB_00150604;
        }
        bVar2 = GenericModel::moveColumns
                          ((QModelIndex *)&probe.field_0x8,(int)local_558,2,(QModelIndex *)0x1,
                           (int)local_558);
        bVar2 = QTest::qVerify((bool)(~bVar2 & 1),
                               "!testModel.moveColumns(parIndex, 2, 1, parIndex, 7)","",
                               "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                               ,0x88b);
        if ((bVar2 & 1) != 0) {
          spy_1 = (QSignalSpy *)(spyArr + 1);
          __end1_1 = (QSignalSpy **)&__range1;
          __begin1_1 = __end1_1;
          for (; (QSignalSpy *)__end1_1 != spy_1; __end1_1 = __end1_1 + 1) {
            local_6d8 = *__end1_1;
            local_6e0 = QList<QList<QVariant>_>::count(&local_6d8->super_QList<QList<QVariant>_>);
            __range1_2._4_4_ = 0;
            bVar1 = QTest::qCompare<long_long,int>
                              (&local_6e0,(qint32 *)((long)&__range1_2 + 4),"spy->count()","0",
                               "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                               ,0x88d);
            if (((bVar1 ^ 0xffU) & 1) != 0) goto LAB_00150604;
          }
          bVar2 = GenericModel::moveColumns
                            ((QModelIndex *)&probe.field_0x8,(int)local_558,-1,(QModelIndex *)0x1,
                             (int)local_558);
          bVar2 = QTest::qVerify((bool)(~bVar2 & 1),
                                 "!testModel.moveColumns(parIndex, -1, 1, parIndex, 3)","",
                                 "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                 ,0x88e);
          if ((bVar2 & 1) != 0) {
            spy_2 = (QSignalSpy *)(spyArr + 1);
            __end1_2 = (QSignalSpy **)&__range1;
            __begin1_2 = __end1_2;
            for (; (QSignalSpy *)__end1_2 != spy_2; __end1_2 = __end1_2 + 1) {
              local_708 = *__end1_2;
              local_710 = QList<QList<QVariant>_>::count(&local_708->super_QList<QList<QVariant>_>);
              __range1_3._4_4_ = 0;
              bVar1 = QTest::qCompare<long_long,int>
                                (&local_710,(qint32 *)((long)&__range1_3 + 4),"spy->count()","0",
                                 "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                 ,0x890);
              if (((bVar1 ^ 0xffU) & 1) != 0) goto LAB_00150604;
            }
            bVar2 = GenericModel::moveColumns
                              ((QModelIndex *)&probe.field_0x8,(int)local_558,6,(QModelIndex *)0x1,
                               (int)local_558);
            bVar2 = QTest::qVerify((bool)(~bVar2 & 1),
                                   "!testModel.moveColumns(parIndex, 6, 1, parIndex, 3)","",
                                   "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                   ,0x891);
            if ((bVar2 & 1) != 0) {
              spy_3 = (QSignalSpy *)(spyArr + 1);
              __end1_3 = (QSignalSpy **)&__range1;
              __begin1_3 = __end1_3;
              for (; (QSignalSpy *)__end1_3 != spy_3; __end1_3 = __end1_3 + 1) {
                local_738 = *__end1_3;
                local_740 = QList<QList<QVariant>_>::count
                                      (&local_738->super_QList<QList<QVariant>_>);
                __range1_4._4_4_ = 0;
                bVar1 = QTest::qCompare<long_long,int>
                                  (&local_740,(qint32 *)((long)&__range1_4 + 4),"spy->count()","0",
                                   "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                   ,0x893);
                if (((bVar1 ^ 0xffU) & 1) != 0) goto LAB_00150604;
              }
              bVar2 = GenericModel::moveColumns
                                ((QModelIndex *)&probe.field_0x8,(int)local_558,1,(QModelIndex *)0x2
                                 ,(int)local_558);
              bVar2 = QTest::qVerify((bool)(~bVar2 & 1),
                                     "!testModel.moveColumns(parIndex, 1, 2, parIndex, 2)","",
                                     "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                     ,0x894);
              if ((bVar2 & 1) != 0) {
                spy_4 = (QSignalSpy *)(spyArr + 1);
                __end1_4 = (QSignalSpy **)&__range1;
                __begin1_4 = __end1_4;
                for (; (QSignalSpy *)__end1_4 != spy_4; __end1_4 = __end1_4 + 1) {
                  local_768 = *__end1_4;
                  local_770 = QList<QList<QVariant>_>::count
                                        (&local_768->super_QList<QList<QVariant>_>);
                  __range1_5._4_4_ = 0;
                  bVar1 = QTest::qCompare<long_long,int>
                                    (&local_770,(qint32 *)((long)&__range1_5 + 4),"spy->count()","0"
                                     ,
                                     "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                     ,0x896);
                  if (((bVar1 ^ 0xffU) & 1) != 0) goto LAB_00150604;
                }
                bVar2 = GenericModel::moveColumns
                                  ((QModelIndex *)&probe.field_0x8,(int)local_558,1,
                                   (QModelIndex *)0x2,(int)local_558);
                bVar2 = QTest::qVerify((bool)(~bVar2 & 1),
                                       "!testModel.moveColumns(parIndex, 1, 2, parIndex, 3)","",
                                       "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                       ,0x897);
                if ((bVar2 & 1) != 0) {
                  spy_5 = (QSignalSpy *)(spyArr + 1);
                  __end1_5 = (QSignalSpy **)&__range1;
                  __begin1_5 = __end1_5;
                  for (; (QSignalSpy *)__end1_5 != spy_5; __end1_5 = __end1_5 + 1) {
                    local_798 = *__end1_5;
                    local_7a0 = QList<QList<QVariant>_>::count
                                          (&local_798->super_QList<QList<QVariant>_>);
                    local_7a4 = 0;
                    bVar1 = QTest::qCompare<long_long,int>
                                      (&local_7a0,&local_7a4,"spy->count()","0",
                                       "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                       ,0x899);
                    if (((bVar1 ^ 0xffU) & 1) != 0) goto LAB_00150604;
                  }
                  GenericModel::index((int)local_7c8,(int)&probe + 8,(QModelIndex *)0x1);
                  QPersistentModelIndex::QPersistentModelIndex(local_7b0,(QModelIndex *)local_7c8);
                  bVar2 = GenericModel::moveColumns
                                    ((QModelIndex *)&probe.field_0x8,(int)local_558,2,
                                     (QModelIndex *)0x1,(int)local_558);
                  bVar2 = QTest::qVerify((bool)(bVar2 & 1),
                                         "testModel.moveColumns(parIndex, 2, 1, parIndex, 4)","",
                                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                         ,0x89c);
                  if ((bVar2 & 1) != 0) {
                    GenericModel::index((int)&local_818,(int)&probe + 8,(QModelIndex *)0x0);
                    QModelIndex::data(&local_800,&local_818,0);
                    QVariant::toString();
                    QArrayDataPointer<char16_t>::QArrayDataPointer(&local_848,(Data *)0x0,L"0,0",3);
                    QString::QString(&local_830,&local_848);
                    bVar1 = QTest::qCompare(&local_7e0,&local_830,
                                            "testModel.index(0, 0, parIndex).data().toString()",
                                            "QStringLiteral(\"0,0\")",
                                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                            ,0x89d);
                    QString::~QString(&local_830);
                    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_848);
                    QString::~QString(&local_7e0);
                    QVariant::~QVariant(&local_800);
                    if (((bVar1 ^ 0xffU) & 1) == 0) {
                      GenericModel::index((int)&local_898,(int)&probe + 8,(QModelIndex *)0x0);
                      QModelIndex::data(&local_880,&local_898,0);
                      QVariant::toString();
                      QArrayDataPointer<char16_t>::QArrayDataPointer
                                (&local_8c8,(Data *)0x0,L"0,1",3);
                      QString::QString(&local_8b0,&local_8c8);
                      bVar1 = QTest::qCompare(&local_860,&local_8b0,
                                              "testModel.index(0, 1, parIndex).data().toString()",
                                              "QStringLiteral(\"0,1\")",
                                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                              ,0x89e);
                      QString::~QString(&local_8b0);
                      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_8c8);
                      QString::~QString(&local_860);
                      QVariant::~QVariant(&local_880);
                      if (((bVar1 ^ 0xffU) & 1) == 0) {
                        GenericModel::index((int)&local_918,(int)&probe + 8,(QModelIndex *)0x0);
                        QModelIndex::data(&local_900,&local_918,0);
                        QVariant::toString();
                        QArrayDataPointer<char16_t>::QArrayDataPointer
                                  (&local_948,(Data *)0x0,L"0,3",3);
                        QString::QString(&local_930,&local_948);
                        bVar1 = QTest::qCompare(&local_8e0,&local_930,
                                                "testModel.index(0, 2, parIndex).data().toString()",
                                                "QStringLiteral(\"0,3\")",
                                                "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                ,0x89f);
                        QString::~QString(&local_930);
                        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_948);
                        QString::~QString(&local_8e0);
                        QVariant::~QVariant(&local_900);
                        if (((bVar1 ^ 0xffU) & 1) == 0) {
                          GenericModel::index((int)&local_998,(int)&probe + 8,(QModelIndex *)0x0);
                          QModelIndex::data(&local_980,&local_998,0);
                          QVariant::toString();
                          QArrayDataPointer<char16_t>::QArrayDataPointer
                                    (&local_9c8,(Data *)0x0,L"0,2",3);
                          QString::QString(&local_9b0,&local_9c8);
                          bVar1 = QTest::qCompare(&local_960,&local_9b0,
                                                  "testModel.index(0, 3, parIndex).data().toString()"
                                                  ,"QStringLiteral(\"0,2\")",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x8a0);
                          QString::~QString(&local_9b0);
                          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_9c8);
                          QString::~QString(&local_960);
                          QVariant::~QVariant(&local_980);
                          if (((bVar1 ^ 0xffU) & 1) == 0) {
                            GenericModel::index((int)&local_a18,(int)&probe + 8,(QModelIndex *)0x0);
                            QModelIndex::data(&local_a00,&local_a18,0);
                            QVariant::toString();
                            QArrayDataPointer<char16_t>::QArrayDataPointer
                                      (&local_a48,(Data *)0x0,L"0,4",3);
                            QString::QString(&local_a30,&local_a48);
                            bVar1 = QTest::qCompare(&local_9e0,&local_a30,
                                                                                                        
                                                  "testModel.index(0, 4, parIndex).data().toString()"
                                                  ,"QStringLiteral(\"0,4\")",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x8a1);
                            QString::~QString(&local_a30);
                            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a48);
                            QString::~QString(&local_9e0);
                            QVariant::~QVariant(&local_a00);
                            if (((bVar1 ^ 0xffU) & 1) == 0) {
                              GenericModel::index((int)&local_a98,(int)&probe + 8,(QModelIndex *)0x0
                                                 );
                              QModelIndex::data(&local_a80,&local_a98,0);
                              QVariant::toString();
                              QArrayDataPointer<char16_t>::QArrayDataPointer
                                        (&local_ac8,(Data *)0x0,L"0,5",3);
                              QString::QString(&local_ab0,&local_ac8);
                              bVar1 = QTest::qCompare(&local_a60,&local_ab0,
                                                                                                            
                                                  "testModel.index(0, 5, parIndex).data().toString()"
                                                  ,"QStringLiteral(\"0,5\")",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x8a2);
                              QString::~QString(&local_ab0);
                              QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_ac8);
                              QString::~QString(&local_a60);
                              QVariant::~QVariant(&local_a80);
                              if (((bVar1 ^ 0xffU) & 1) == 0) {
                                GenericModel::index((int)&local_b18,(int)&probe + 8,
                                                    (QModelIndex *)0x1);
                                QModelIndex::data(&local_b00,&local_b18,0);
                                QVariant::toString();
                                QArrayDataPointer<char16_t>::QArrayDataPointer
                                          (&local_b48,(Data *)0x0,L"1,0",3);
                                QString::QString(&local_b30,&local_b48);
                                bVar1 = QTest::qCompare(&local_ae0,&local_b30,
                                                                                                                
                                                  "testModel.index(1, 0, parIndex).data().toString()"
                                                  ,"QStringLiteral(\"1,0\")",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x8a3);
                                QString::~QString(&local_b30);
                                QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b48);
                                QString::~QString(&local_ae0);
                                QVariant::~QVariant(&local_b00);
                                if (((bVar1 ^ 0xffU) & 1) == 0) {
                                  GenericModel::index((int)&local_b98,(int)&probe + 8,
                                                      (QModelIndex *)0x1);
                                  QModelIndex::data(&local_b80,&local_b98,0);
                                  QVariant::toString();
                                  QArrayDataPointer<char16_t>::QArrayDataPointer
                                            (&local_bc8,(Data *)0x0,L"1,1",3);
                                  QString::QString(&local_bb0,&local_bc8);
                                  bVar1 = QTest::qCompare(&local_b60,&local_bb0,
                                                                                                                    
                                                  "testModel.index(1, 1, parIndex).data().toString()"
                                                  ,"QStringLiteral(\"1,1\")",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x8a4);
                                  QString::~QString(&local_bb0);
                                  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_bc8);
                                  QString::~QString(&local_b60);
                                  QVariant::~QVariant(&local_b80);
                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                    GenericModel::index((int)&local_c18,(int)&probe + 8,
                                                        (QModelIndex *)0x1);
                                    QModelIndex::data(&local_c00,&local_c18,0);
                                    QVariant::toString();
                                    QArrayDataPointer<char16_t>::QArrayDataPointer
                                              (&local_c48,(Data *)0x0,L"1,3",3);
                                    QString::QString(&local_c30,&local_c48);
                                    bVar1 = QTest::qCompare(&local_be0,&local_c30,
                                                                                                                        
                                                  "testModel.index(1, 2, parIndex).data().toString()"
                                                  ,"QStringLiteral(\"1,3\")",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x8a5);
                                    QString::~QString(&local_c30);
                                    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_c48);
                                    QString::~QString(&local_be0);
                                    QVariant::~QVariant(&local_c00);
                                    if (((bVar1 ^ 0xffU) & 1) == 0) {
                                      GenericModel::index((int)&local_c98,(int)&probe + 8,
                                                          (QModelIndex *)0x1);
                                      QModelIndex::data(&local_c80,&local_c98,0);
                                      QVariant::toString();
                                      QArrayDataPointer<char16_t>::QArrayDataPointer
                                                (&local_cc8,(Data *)0x0,L"1,2",3);
                                      QString::QString(&local_cb0,&local_cc8);
                                      bVar1 = QTest::qCompare(&local_c60,&local_cb0,
                                                                                                                            
                                                  "testModel.index(1, 3, parIndex).data().toString()"
                                                  ,"QStringLiteral(\"1,2\")",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x8a6);
                                      QString::~QString(&local_cb0);
                                      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_cc8);
                                      QString::~QString(&local_c60);
                                      QVariant::~QVariant(&local_c80);
                                      if (((bVar1 ^ 0xffU) & 1) == 0) {
                                        GenericModel::index((int)&local_d18,(int)&probe + 8,
                                                            (QModelIndex *)0x1);
                                        QModelIndex::data(&local_d00,&local_d18,0);
                                        QVariant::toString();
                                        QArrayDataPointer<char16_t>::QArrayDataPointer
                                                  (&local_d48,(Data *)0x0,L"1,4",3);
                                        QString::QString(&local_d30,&local_d48);
                                        bVar1 = QTest::qCompare(&local_ce0,&local_d30,
                                                                                                                                
                                                  "testModel.index(1, 4, parIndex).data().toString()"
                                                  ,"QStringLiteral(\"1,4\")",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x8a7);
                                        QString::~QString(&local_d30);
                                        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_d48);
                                        QString::~QString(&local_ce0);
                                        QVariant::~QVariant(&local_d00);
                                        if (((bVar1 ^ 0xffU) & 1) == 0) {
                                          GenericModel::index((int)&local_d98,(int)&probe + 8,
                                                              (QModelIndex *)0x1);
                                          QModelIndex::data(&local_d80,&local_d98,0);
                                          QVariant::toString();
                                          QArrayDataPointer<char16_t>::QArrayDataPointer
                                                    (&local_dc8,(Data *)0x0,L"1,5",3);
                                          QString::QString(&local_db0,&local_dc8);
                                          bVar1 = QTest::qCompare(&local_d60,&local_db0,
                                                                                                                                    
                                                  "testModel.index(1, 5, parIndex).data().toString()"
                                                  ,"QStringLiteral(\"1,5\")",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x8a8);
                                          QString::~QString(&local_db0);
                                          QArrayDataPointer<char16_t>::~QArrayDataPointer
                                                    (&local_dc8);
                                          QString::~QString(&local_d60);
                                          QVariant::~QVariant(&local_d80);
                                          if (((bVar1 ^ 0xffU) & 1) == 0) {
                                            QPersistentModelIndex::data((int)&local_e00);
                                            QVariant::toString();
                                            QArrayDataPointer<char16_t>::QArrayDataPointer
                                                      ((QArrayDataPointer<char16_t> *)&__range1_6,
                                                       (Data *)0x0,L"1,2",3);
                                            QString::QString(&local_e18,(DataPointer *)&__range1_6);
                                            bVar1 = QTest::qCompare(&local_de0,&local_e18,
                                                                    "oneTwoIndex.data().toString()",
                                                                    "QStringLiteral(\"1,2\")",
                                                                                                                                        
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x8a9);
                                            QString::~QString(&local_e18);
                                            QArrayDataPointer<char16_t>::~QArrayDataPointer
                                                      ((QArrayDataPointer<char16_t> *)&__range1_6);
                                            QString::~QString(&local_de0);
                                            QVariant::~QVariant(&local_e00);
                                            if (((bVar1 ^ 0xffU) & 1) == 0) {
                                              iVar3 = QPersistentModelIndex::column();
                                              bVar2 = QTest::qCompare(iVar3,3,"oneTwoIndex.column()"
                                                                      ,"3",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x8aa);
                                              if ((bVar2 & 1) != 0) {
                                                spy_6 = (QSignalSpy *)(spyArr + 1);
                                                __end1_6 = (QSignalSpy **)&__range1;
                                                __begin1_6 = __end1_6;
                                                for (; (QSignalSpy *)__end1_6 != spy_6;
                                                    __end1_6 = __end1_6 + 1) {
                                                  local_e50 = *__end1_6;
                                                  local_e58 = QList<QList<QVariant>_>::count
                                                                        (&local_e50->
                                                                                                                                                    
                                                  super_QList<QList<QVariant>_>);
                                                  args.d.size._4_4_ = 1;
                                                  bVar1 = QTest::qCompare<long_long,int>
                                                                    (&local_e58,
                                                                     (qint32 *)
                                                                     ((long)&args.d.size + 4),
                                                                     "spy->count()","1",
                                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x8ac);
                                                  if (((bVar1 ^ 0xffU) & 1) != 0) goto LAB_001505f8;
                                                  QList<QList<QVariant>_>::takeFirst
                                                            ((value_type *)local_e78,
                                                             &local_e50->
                                                              super_QList<QList<QVariant>_>);
                                                  pQVar4 = QList<QVariant>::at((QList<QVariant> *)
                                                                               local_e78,0);
                                                  QVariant::value<QModelIndex>(&local_e90,pQVar4);
                                                  bVar1 = QTest::qCompare<QModelIndex,QModelIndex>
                                                                    (&local_e90,
                                                                     (QModelIndex *)local_558,
                                                                                                                                          
                                                  "args.at(0).value<QModelIndex>()","parIndex",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x8ae);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    pQVar4 = QList<QVariant>::at((QList<QVariant> *)
                                                                                 local_e78,1);
                                                    iVar3 = QVariant::toInt((bool *)pQVar4);
                                                    bVar2 = QTest::qCompare(iVar3,2,
                                                  "args.at(1).toInt()","2",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x8af);
                                                  if ((bVar2 & 1) == 0) {
                                                    bVar1 = true;
                                                  }
                                                  else {
                                                    pQVar4 = QList<QVariant>::at((QList<QVariant> *)
                                                                                 local_e78,2);
                                                    iVar3 = QVariant::toInt((bool *)pQVar4);
                                                    bVar2 = QTest::qCompare(iVar3,2,
                                                  "args.at(2).toInt()","2",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x8b0);
                                                  if ((bVar2 & 1) == 0) {
                                                    bVar1 = true;
                                                  }
                                                  else {
                                                    pQVar4 = QList<QVariant>::at((QList<QVariant> *)
                                                                                 local_e78,3);
                                                    QVariant::value<QModelIndex>(&local_ea8,pQVar4);
                                                    bVar1 = QTest::qCompare<QModelIndex,QModelIndex>
                                                                      (&local_ea8,
                                                                       (QModelIndex *)local_558,
                                                                                                                                              
                                                  "args.at(3).value<QModelIndex>()","parIndex",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x8b1);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    pQVar4 = QList<QVariant>::at((QList<QVariant> *)
                                                                                 local_e78,4);
                                                    iVar3 = QVariant::toInt((bool *)pQVar4);
                                                    bVar2 = QTest::qCompare(iVar3,4,
                                                  "args.at(4).toInt()","4",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x8b2);
                                                  if ((bVar2 & 1) == 0) {
                                                    bVar1 = true;
                                                  }
                                                  else {
                                                    bVar1 = false;
                                                  }
                                                  }
                                                  else {
                                                    bVar1 = true;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  else {
                                                    bVar1 = true;
                                                  }
                                                  QList<QVariant>::~QList
                                                            ((QList<QVariant> *)local_e78);
                                                  if (bVar1) goto LAB_001505f8;
                                                }
                                                fillTable(this,(QAbstractItemModel *)
                                                               &probe.field_0x8,2,6,
                                                          (QModelIndex *)local_558,0);
                                                GenericModel::index((int)local_ec0,(int)&probe + 8,
                                                                    (QModelIndex *)0x1);
                                                QPersistentModelIndex::operator=
                                                          (local_7b0,(QModelIndex *)local_ec0);
                                                bVar2 = GenericModel::moveColumns
                                                                  ((QModelIndex *)&probe.field_0x8,
                                                                   (int)local_558,2,
                                                                   (QModelIndex *)0x1,(int)local_558
                                                                  );
                                                bVar2 = QTest::qVerify((bool)(bVar2 & 1),
                                                                                                                                              
                                                  "testModel.moveColumns(parIndex, 2, 1, parIndex, 0)"
                                                  ,"",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x8b7);
                                                if ((bVar2 & 1) != 0) {
                                                  GenericModel::index((int)&local_f10,
                                                                      (int)&probe + 8,
                                                                      (QModelIndex *)0x0);
                                                  QModelIndex::data(&local_ef8,&local_f10,0);
                                                  QVariant::toString();
                                                  QArrayDataPointer<char16_t>::QArrayDataPointer
                                                            (&local_f40,(Data *)0x0,L"0,2",3);
                                                  QString::QString(&local_f28,&local_f40);
                                                  bVar1 = QTest::qCompare(&local_ed8,&local_f28,
                                                                                                                                                    
                                                  "testModel.index(0, 0, parIndex).data().toString()"
                                                  ,"QStringLiteral(\"0,2\")",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x8b8);
                                                  QString::~QString(&local_f28);
                                                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                                                            (&local_f40);
                                                  QString::~QString(&local_ed8);
                                                  QVariant::~QVariant(&local_ef8);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    GenericModel::index((int)&local_f90,
                                                                        (int)&probe + 8,
                                                                        (QModelIndex *)0x0);
                                                    QModelIndex::data(&local_f78,&local_f90,0);
                                                    QVariant::toString();
                                                    QArrayDataPointer<char16_t>::QArrayDataPointer
                                                              (&local_fc0,(Data *)0x0,L"0,0",3);
                                                    QString::QString(&local_fa8,&local_fc0);
                                                    bVar1 = QTest::qCompare(&local_f58,&local_fa8,
                                                                                                                                                        
                                                  "testModel.index(0, 1, parIndex).data().toString()"
                                                  ,"QStringLiteral(\"0,0\")",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x8b9);
                                                  QString::~QString(&local_fa8);
                                                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                                                            (&local_fc0);
                                                  QString::~QString(&local_f58);
                                                  QVariant::~QVariant(&local_f78);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    GenericModel::index((int)&local_1010,
                                                                        (int)&probe + 8,
                                                                        (QModelIndex *)0x0);
                                                    QModelIndex::data(&local_ff8,&local_1010,0);
                                                    QVariant::toString();
                                                    QArrayDataPointer<char16_t>::QArrayDataPointer
                                                              (&local_1040,(Data *)0x0,L"0,1",3);
                                                    QString::QString(&local_1028,&local_1040);
                                                    bVar1 = QTest::qCompare(&local_fd8,&local_1028,
                                                                                                                                                        
                                                  "testModel.index(0, 2, parIndex).data().toString()"
                                                  ,"QStringLiteral(\"0,1\")",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x8ba);
                                                  QString::~QString(&local_1028);
                                                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                                                            (&local_1040);
                                                  QString::~QString(&local_fd8);
                                                  QVariant::~QVariant(&local_ff8);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    GenericModel::index((int)&local_1090,
                                                                        (int)&probe + 8,
                                                                        (QModelIndex *)0x0);
                                                    QModelIndex::data(&local_1078,&local_1090,0);
                                                    QVariant::toString();
                                                    QArrayDataPointer<char16_t>::QArrayDataPointer
                                                              (&local_10c0,(Data *)0x0,L"0,3",3);
                                                    QString::QString(&local_10a8,&local_10c0);
                                                    bVar1 = QTest::qCompare(&local_1058,&local_10a8,
                                                                                                                                                        
                                                  "testModel.index(0, 3, parIndex).data().toString()"
                                                  ,"QStringLiteral(\"0,3\")",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x8bb);
                                                  QString::~QString(&local_10a8);
                                                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                                                            (&local_10c0);
                                                  QString::~QString(&local_1058);
                                                  QVariant::~QVariant(&local_1078);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    GenericModel::index((int)&local_1110,
                                                                        (int)&probe + 8,
                                                                        (QModelIndex *)0x0);
                                                    QModelIndex::data(&local_10f8,&local_1110,0);
                                                    QVariant::toString();
                                                    QArrayDataPointer<char16_t>::QArrayDataPointer
                                                              (&local_1140,(Data *)0x0,L"0,4",3);
                                                    QString::QString(&local_1128,&local_1140);
                                                    bVar1 = QTest::qCompare(&local_10d8,&local_1128,
                                                                                                                                                        
                                                  "testModel.index(0, 4, parIndex).data().toString()"
                                                  ,"QStringLiteral(\"0,4\")",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x8bc);
                                                  QString::~QString(&local_1128);
                                                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                                                            (&local_1140);
                                                  QString::~QString(&local_10d8);
                                                  QVariant::~QVariant(&local_10f8);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    GenericModel::index((int)&local_1190,
                                                                        (int)&probe + 8,
                                                                        (QModelIndex *)0x0);
                                                    QModelIndex::data(&local_1178,&local_1190,0);
                                                    QVariant::toString();
                                                    QArrayDataPointer<char16_t>::QArrayDataPointer
                                                              (&local_11c0,(Data *)0x0,L"0,5",3);
                                                    QString::QString(&local_11a8,&local_11c0);
                                                    bVar1 = QTest::qCompare(&local_1158,&local_11a8,
                                                                                                                                                        
                                                  "testModel.index(0, 5, parIndex).data().toString()"
                                                  ,"QStringLiteral(\"0,5\")",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x8bd);
                                                  QString::~QString(&local_11a8);
                                                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                                                            (&local_11c0);
                                                  QString::~QString(&local_1158);
                                                  QVariant::~QVariant(&local_1178);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    GenericModel::index((int)&local_1210,
                                                                        (int)&probe + 8,
                                                                        (QModelIndex *)0x1);
                                                    QModelIndex::data(&local_11f8,&local_1210,0);
                                                    QVariant::toString();
                                                    QArrayDataPointer<char16_t>::QArrayDataPointer
                                                              (&local_1240,(Data *)0x0,L"1,2",3);
                                                    QString::QString(&local_1228,&local_1240);
                                                    bVar1 = QTest::qCompare(&local_11d8,&local_1228,
                                                                                                                                                        
                                                  "testModel.index(1, 0, parIndex).data().toString()"
                                                  ,"QStringLiteral(\"1,2\")",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x8be);
                                                  QString::~QString(&local_1228);
                                                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                                                            (&local_1240);
                                                  QString::~QString(&local_11d8);
                                                  QVariant::~QVariant(&local_11f8);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    GenericModel::index((int)&local_1290,
                                                                        (int)&probe + 8,
                                                                        (QModelIndex *)0x1);
                                                    QModelIndex::data(&local_1278,&local_1290,0);
                                                    QVariant::toString();
                                                    QArrayDataPointer<char16_t>::QArrayDataPointer
                                                              (&local_12c0,(Data *)0x0,L"1,0",3);
                                                    QString::QString(&local_12a8,&local_12c0);
                                                    bVar1 = QTest::qCompare(&local_1258,&local_12a8,
                                                                                                                                                        
                                                  "testModel.index(1, 1, parIndex).data().toString()"
                                                  ,"QStringLiteral(\"1,0\")",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x8bf);
                                                  QString::~QString(&local_12a8);
                                                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                                                            (&local_12c0);
                                                  QString::~QString(&local_1258);
                                                  QVariant::~QVariant(&local_1278);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    GenericModel::index((int)&local_1310,
                                                                        (int)&probe + 8,
                                                                        (QModelIndex *)0x1);
                                                    QModelIndex::data(&local_12f8,&local_1310,0);
                                                    QVariant::toString();
                                                    QArrayDataPointer<char16_t>::QArrayDataPointer
                                                              (&local_1340,(Data *)0x0,L"1,1",3);
                                                    QString::QString(&local_1328,&local_1340);
                                                    bVar1 = QTest::qCompare(&local_12d8,&local_1328,
                                                                                                                                                        
                                                  "testModel.index(1, 2, parIndex).data().toString()"
                                                  ,"QStringLiteral(\"1,1\")",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x8c0);
                                                  QString::~QString(&local_1328);
                                                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                                                            (&local_1340);
                                                  QString::~QString(&local_12d8);
                                                  QVariant::~QVariant(&local_12f8);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    GenericModel::index((int)&local_1390,
                                                                        (int)&probe + 8,
                                                                        (QModelIndex *)0x1);
                                                    QModelIndex::data(&local_1378,&local_1390,0);
                                                    QVariant::toString();
                                                    QArrayDataPointer<char16_t>::QArrayDataPointer
                                                              (&local_13c0,(Data *)0x0,L"1,3",3);
                                                    QString::QString(&local_13a8,&local_13c0);
                                                    bVar1 = QTest::qCompare(&local_1358,&local_13a8,
                                                                                                                                                        
                                                  "testModel.index(1, 3, parIndex).data().toString()"
                                                  ,"QStringLiteral(\"1,3\")",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x8c1);
                                                  QString::~QString(&local_13a8);
                                                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                                                            (&local_13c0);
                                                  QString::~QString(&local_1358);
                                                  QVariant::~QVariant(&local_1378);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    GenericModel::index((int)&local_1410,
                                                                        (int)&probe + 8,
                                                                        (QModelIndex *)0x1);
                                                    QModelIndex::data(&local_13f8,&local_1410,0);
                                                    QVariant::toString();
                                                    QArrayDataPointer<char16_t>::QArrayDataPointer
                                                              (&local_1440,(Data *)0x0,L"1,4",3);
                                                    QString::QString(&local_1428,&local_1440);
                                                    bVar1 = QTest::qCompare(&local_13d8,&local_1428,
                                                                                                                                                        
                                                  "testModel.index(1, 4, parIndex).data().toString()"
                                                  ,"QStringLiteral(\"1,4\")",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x8c2);
                                                  QString::~QString(&local_1428);
                                                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                                                            (&local_1440);
                                                  QString::~QString(&local_13d8);
                                                  QVariant::~QVariant(&local_13f8);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    GenericModel::index((int)&local_1490,
                                                                        (int)&probe + 8,
                                                                        (QModelIndex *)0x1);
                                                    QModelIndex::data(&local_1478,&local_1490,0);
                                                    QVariant::toString();
                                                    QArrayDataPointer<char16_t>::QArrayDataPointer
                                                              (&local_14c0,(Data *)0x0,L"1,5",3);
                                                    QString::QString(&local_14a8,&local_14c0);
                                                    bVar1 = QTest::qCompare(&local_1458,&local_14a8,
                                                                                                                                                        
                                                  "testModel.index(1, 5, parIndex).data().toString()"
                                                  ,"QStringLiteral(\"1,5\")",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x8c3);
                                                  QString::~QString(&local_14a8);
                                                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                                                            (&local_14c0);
                                                  QString::~QString(&local_1458);
                                                  QVariant::~QVariant(&local_1478);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    QPersistentModelIndex::data((int)&local_14f8);
                                                    QVariant::toString();
                                                    QArrayDataPointer<char16_t>::QArrayDataPointer
                                                              ((QArrayDataPointer<char16_t> *)
                                                               &__range1_7,(Data *)0x0,L"1,2",3);
                                                    QString::QString(&local_1510,
                                                                     (DataPointer *)&__range1_7);
                                                    bVar1 = QTest::qCompare(&local_14d8,&local_1510,
                                                                                                                                                        
                                                  "oneTwoIndex.data().toString()",
                                                  "QStringLiteral(\"1,2\")",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x8c4);
                                                  QString::~QString(&local_1510);
                                                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                                                            ((QArrayDataPointer<char16_t> *)
                                                             &__range1_7);
                                                  QString::~QString(&local_14d8);
                                                  QVariant::~QVariant(&local_14f8);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    iVar3 = QPersistentModelIndex::column();
                                                    bVar2 = QTest::qCompare(iVar3,0,
                                                  "oneTwoIndex.column()","0",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x8c5);
                                                  if ((bVar2 & 1) != 0) {
                                                    spy_7 = (QSignalSpy *)(spyArr + 1);
                                                    __end1_7 = (QSignalSpy **)&__range1;
                                                    __begin1_7 = __end1_7;
                                                    for (; (QSignalSpy *)__end1_7 != spy_7;
                                                        __end1_7 = __end1_7 + 1) {
                                                      local_1548 = *__end1_7;
                                                      local_1550 = QList<QList<QVariant>_>::count
                                                                             (&local_1548->
                                                                                                                                                              
                                                  super_QList<QList<QVariant>_>);
                                                  args_1.d.size._4_4_ = 1;
                                                  bVar1 = QTest::qCompare<long_long,int>
                                                                    (&local_1550,
                                                                     (qint32 *)
                                                                     ((long)&args_1.d.size + 4),
                                                                     "spy->count()","1",
                                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x8c7);
                                                  if (((bVar1 ^ 0xffU) & 1) != 0) goto LAB_001505f8;
                                                  QList<QList<QVariant>_>::takeFirst
                                                            ((value_type *)local_1570,
                                                             &local_1548->
                                                              super_QList<QList<QVariant>_>);
                                                  pQVar4 = QList<QVariant>::at((QList<QVariant> *)
                                                                               local_1570,0);
                                                  QVariant::value<QModelIndex>(&local_1588,pQVar4);
                                                  bVar1 = QTest::qCompare<QModelIndex,QModelIndex>
                                                                    (&local_1588,
                                                                     (QModelIndex *)local_558,
                                                                                                                                          
                                                  "args.at(0).value<QModelIndex>()","parIndex",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x8c9);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    pQVar4 = QList<QVariant>::at((QList<QVariant> *)
                                                                                 local_1570,1);
                                                    iVar3 = QVariant::toInt((bool *)pQVar4);
                                                    bVar2 = QTest::qCompare(iVar3,2,
                                                  "args.at(1).toInt()","2",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x8ca);
                                                  if ((bVar2 & 1) == 0) {
                                                    bVar1 = true;
                                                  }
                                                  else {
                                                    pQVar4 = QList<QVariant>::at((QList<QVariant> *)
                                                                                 local_1570,2);
                                                    iVar3 = QVariant::toInt((bool *)pQVar4);
                                                    bVar2 = QTest::qCompare(iVar3,2,
                                                  "args.at(2).toInt()","2",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x8cb);
                                                  if ((bVar2 & 1) == 0) {
                                                    bVar1 = true;
                                                  }
                                                  else {
                                                    pQVar4 = QList<QVariant>::at((QList<QVariant> *)
                                                                                 local_1570,3);
                                                    QVariant::value<QModelIndex>(&local_15a0,pQVar4)
                                                    ;
                                                    bVar1 = QTest::qCompare<QModelIndex,QModelIndex>
                                                                      (&local_15a0,
                                                                       (QModelIndex *)local_558,
                                                                                                                                              
                                                  "args.at(3).value<QModelIndex>()","parIndex",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x8cc);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    pQVar4 = QList<QVariant>::at((QList<QVariant> *)
                                                                                 local_1570,4);
                                                    iVar3 = QVariant::toInt((bool *)pQVar4);
                                                    bVar2 = QTest::qCompare(iVar3,0,
                                                  "args.at(4).toInt()","0",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x8cd);
                                                  if ((bVar2 & 1) == 0) {
                                                    bVar1 = true;
                                                  }
                                                  else {
                                                    bVar1 = false;
                                                  }
                                                  }
                                                  else {
                                                    bVar1 = true;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  else {
                                                    bVar1 = true;
                                                  }
                                                  QList<QVariant>::~QList
                                                            ((QList<QVariant> *)local_1570);
                                                  if (bVar1) goto LAB_001505f8;
                                                  }
                                                  fillTable(this,(QAbstractItemModel *)
                                                                 &probe.field_0x8,2,6,
                                                            (QModelIndex *)local_558,0);
                                                  GenericModel::index((int)local_15b8,
                                                                      (int)&probe + 8,
                                                                      (QModelIndex *)0x1);
                                                  QPersistentModelIndex::operator=
                                                            (local_7b0,(QModelIndex *)local_15b8);
                                                  bVar2 = GenericModel::moveColumns
                                                                    ((QModelIndex *)&probe.field_0x8
                                                                     ,(int)local_558,2,
                                                                     (QModelIndex *)0x1,
                                                                     (int)local_558);
                                                  bVar2 = QTest::qVerify((bool)(bVar2 & 1),
                                                                                                                                                  
                                                  "testModel.moveColumns(parIndex, 2, 1, parIndex, 6)"
                                                  ,"",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x8d2);
                                                  if ((bVar2 & 1) != 0) {
                                                    GenericModel::index((int)&local_1608,
                                                                        (int)&probe + 8,
                                                                        (QModelIndex *)0x0);
                                                    QModelIndex::data(&local_15f0,&local_1608,0);
                                                    QVariant::toString();
                                                    QArrayDataPointer<char16_t>::QArrayDataPointer
                                                              (&local_1638,(Data *)0x0,L"0,0",3);
                                                    QString::QString(&local_1620,&local_1638);
                                                    bVar1 = QTest::qCompare(&local_15d0,&local_1620,
                                                                                                                                                        
                                                  "testModel.index(0, 0, parIndex).data().toString()"
                                                  ,"QStringLiteral(\"0,0\")",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x8d3);
                                                  QString::~QString(&local_1620);
                                                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                                                            (&local_1638);
                                                  QString::~QString(&local_15d0);
                                                  QVariant::~QVariant(&local_15f0);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    GenericModel::index((int)&local_1688,
                                                                        (int)&probe + 8,
                                                                        (QModelIndex *)0x0);
                                                    QModelIndex::data(&local_1670,&local_1688,0);
                                                    QVariant::toString();
                                                    QArrayDataPointer<char16_t>::QArrayDataPointer
                                                              (&local_16b8,(Data *)0x0,L"0,1",3);
                                                    QString::QString(&local_16a0,&local_16b8);
                                                    bVar1 = QTest::qCompare(&local_1650,&local_16a0,
                                                                                                                                                        
                                                  "testModel.index(0, 1, parIndex).data().toString()"
                                                  ,"QStringLiteral(\"0,1\")",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x8d4);
                                                  QString::~QString(&local_16a0);
                                                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                                                            (&local_16b8);
                                                  QString::~QString(&local_1650);
                                                  QVariant::~QVariant(&local_1670);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    GenericModel::index((int)&local_1708,
                                                                        (int)&probe + 8,
                                                                        (QModelIndex *)0x0);
                                                    QModelIndex::data(&local_16f0,&local_1708,0);
                                                    QVariant::toString();
                                                    QArrayDataPointer<char16_t>::QArrayDataPointer
                                                              (&local_1738,(Data *)0x0,L"0,3",3);
                                                    QString::QString(&local_1720,&local_1738);
                                                    bVar1 = QTest::qCompare(&local_16d0,&local_1720,
                                                                                                                                                        
                                                  "testModel.index(0, 2, parIndex).data().toString()"
                                                  ,"QStringLiteral(\"0,3\")",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x8d5);
                                                  QString::~QString(&local_1720);
                                                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                                                            (&local_1738);
                                                  QString::~QString(&local_16d0);
                                                  QVariant::~QVariant(&local_16f0);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    GenericModel::index((int)&local_1788,
                                                                        (int)&probe + 8,
                                                                        (QModelIndex *)0x0);
                                                    QModelIndex::data(&local_1770,&local_1788,0);
                                                    QVariant::toString();
                                                    QArrayDataPointer<char16_t>::QArrayDataPointer
                                                              (&local_17b8,(Data *)0x0,L"0,4",3);
                                                    QString::QString(&local_17a0,&local_17b8);
                                                    bVar1 = QTest::qCompare(&local_1750,&local_17a0,
                                                                                                                                                        
                                                  "testModel.index(0, 3, parIndex).data().toString()"
                                                  ,"QStringLiteral(\"0,4\")",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x8d6);
                                                  QString::~QString(&local_17a0);
                                                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                                                            (&local_17b8);
                                                  QString::~QString(&local_1750);
                                                  QVariant::~QVariant(&local_1770);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    GenericModel::index((int)&local_1808,
                                                                        (int)&probe + 8,
                                                                        (QModelIndex *)0x0);
                                                    QModelIndex::data(&local_17f0,&local_1808,0);
                                                    QVariant::toString();
                                                    QArrayDataPointer<char16_t>::QArrayDataPointer
                                                              (&local_1838,(Data *)0x0,L"0,5",3);
                                                    QString::QString(&local_1820,&local_1838);
                                                    bVar1 = QTest::qCompare(&local_17d0,&local_1820,
                                                                                                                                                        
                                                  "testModel.index(0, 4, parIndex).data().toString()"
                                                  ,"QStringLiteral(\"0,5\")",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x8d7);
                                                  QString::~QString(&local_1820);
                                                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                                                            (&local_1838);
                                                  QString::~QString(&local_17d0);
                                                  QVariant::~QVariant(&local_17f0);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    GenericModel::index((int)&local_1888,
                                                                        (int)&probe + 8,
                                                                        (QModelIndex *)0x0);
                                                    QModelIndex::data(&local_1870,&local_1888,0);
                                                    QVariant::toString();
                                                    QArrayDataPointer<char16_t>::QArrayDataPointer
                                                              (&local_18b8,(Data *)0x0,L"0,2",3);
                                                    QString::QString(&local_18a0,&local_18b8);
                                                    bVar1 = QTest::qCompare(&local_1850,&local_18a0,
                                                                                                                                                        
                                                  "testModel.index(0, 5, parIndex).data().toString()"
                                                  ,"QStringLiteral(\"0,2\")",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x8d8);
                                                  QString::~QString(&local_18a0);
                                                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                                                            (&local_18b8);
                                                  QString::~QString(&local_1850);
                                                  QVariant::~QVariant(&local_1870);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    GenericModel::index((int)&local_1908,
                                                                        (int)&probe + 8,
                                                                        (QModelIndex *)0x1);
                                                    QModelIndex::data(&local_18f0,&local_1908,0);
                                                    QVariant::toString();
                                                    QArrayDataPointer<char16_t>::QArrayDataPointer
                                                              (&local_1938,(Data *)0x0,L"1,0",3);
                                                    QString::QString(&local_1920,&local_1938);
                                                    bVar1 = QTest::qCompare(&local_18d0,&local_1920,
                                                                                                                                                        
                                                  "testModel.index(1, 0, parIndex).data().toString()"
                                                  ,"QStringLiteral(\"1,0\")",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x8d9);
                                                  QString::~QString(&local_1920);
                                                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                                                            (&local_1938);
                                                  QString::~QString(&local_18d0);
                                                  QVariant::~QVariant(&local_18f0);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    GenericModel::index((int)&local_1988,
                                                                        (int)&probe + 8,
                                                                        (QModelIndex *)0x1);
                                                    QModelIndex::data(&local_1970,&local_1988,0);
                                                    QVariant::toString();
                                                    QArrayDataPointer<char16_t>::QArrayDataPointer
                                                              (&local_19b8,(Data *)0x0,L"1,1",3);
                                                    QString::QString(&local_19a0,&local_19b8);
                                                    bVar1 = QTest::qCompare(&local_1950,&local_19a0,
                                                                                                                                                        
                                                  "testModel.index(1, 1, parIndex).data().toString()"
                                                  ,"QStringLiteral(\"1,1\")",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x8da);
                                                  QString::~QString(&local_19a0);
                                                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                                                            (&local_19b8);
                                                  QString::~QString(&local_1950);
                                                  QVariant::~QVariant(&local_1970);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    GenericModel::index((int)&local_1a08,
                                                                        (int)&probe + 8,
                                                                        (QModelIndex *)0x1);
                                                    QModelIndex::data(&local_19f0,&local_1a08,0);
                                                    QVariant::toString();
                                                    QArrayDataPointer<char16_t>::QArrayDataPointer
                                                              (&local_1a38,(Data *)0x0,L"1,3",3);
                                                    QString::QString(&local_1a20,&local_1a38);
                                                    bVar1 = QTest::qCompare(&local_19d0,&local_1a20,
                                                                                                                                                        
                                                  "testModel.index(1, 2, parIndex).data().toString()"
                                                  ,"QStringLiteral(\"1,3\")",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x8db);
                                                  QString::~QString(&local_1a20);
                                                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                                                            (&local_1a38);
                                                  QString::~QString(&local_19d0);
                                                  QVariant::~QVariant(&local_19f0);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    GenericModel::index((int)&local_1a88,
                                                                        (int)&probe + 8,
                                                                        (QModelIndex *)0x1);
                                                    QModelIndex::data(&local_1a70,&local_1a88,0);
                                                    QVariant::toString();
                                                    QArrayDataPointer<char16_t>::QArrayDataPointer
                                                              (&local_1ab8,(Data *)0x0,L"1,4",3);
                                                    QString::QString(&local_1aa0,&local_1ab8);
                                                    bVar1 = QTest::qCompare(&local_1a50,&local_1aa0,
                                                                                                                                                        
                                                  "testModel.index(1, 3, parIndex).data().toString()"
                                                  ,"QStringLiteral(\"1,4\")",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x8dc);
                                                  QString::~QString(&local_1aa0);
                                                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                                                            (&local_1ab8);
                                                  QString::~QString(&local_1a50);
                                                  QVariant::~QVariant(&local_1a70);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    GenericModel::index((int)&local_1b08,
                                                                        (int)&probe + 8,
                                                                        (QModelIndex *)0x1);
                                                    QModelIndex::data(&local_1af0,&local_1b08,0);
                                                    QVariant::toString();
                                                    QArrayDataPointer<char16_t>::QArrayDataPointer
                                                              (&local_1b38,(Data *)0x0,L"1,5",3);
                                                    QString::QString(&local_1b20,&local_1b38);
                                                    bVar1 = QTest::qCompare(&local_1ad0,&local_1b20,
                                                                                                                                                        
                                                  "testModel.index(1, 4, parIndex).data().toString()"
                                                  ,"QStringLiteral(\"1,5\")",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x8dd);
                                                  QString::~QString(&local_1b20);
                                                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                                                            (&local_1b38);
                                                  QString::~QString(&local_1ad0);
                                                  QVariant::~QVariant(&local_1af0);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    GenericModel::index((int)&local_1b88,
                                                                        (int)&probe + 8,
                                                                        (QModelIndex *)0x1);
                                                    QModelIndex::data(&local_1b70,&local_1b88,0);
                                                    QVariant::toString();
                                                    QArrayDataPointer<char16_t>::QArrayDataPointer
                                                              (&local_1bb8,(Data *)0x0,L"1,2",3);
                                                    QString::QString(&local_1ba0,&local_1bb8);
                                                    bVar1 = QTest::qCompare(&local_1b50,&local_1ba0,
                                                                                                                                                        
                                                  "testModel.index(1, 5, parIndex).data().toString()"
                                                  ,"QStringLiteral(\"1,2\")",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x8de);
                                                  QString::~QString(&local_1ba0);
                                                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                                                            (&local_1bb8);
                                                  QString::~QString(&local_1b50);
                                                  QVariant::~QVariant(&local_1b70);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    QPersistentModelIndex::data((int)&local_1bf0);
                                                    QVariant::toString();
                                                    QArrayDataPointer<char16_t>::QArrayDataPointer
                                                              ((QArrayDataPointer<char16_t> *)
                                                               &__range1_8,(Data *)0x0,L"1,2",3);
                                                    QString::QString(&local_1c08,
                                                                     (DataPointer *)&__range1_8);
                                                    bVar1 = QTest::qCompare(&local_1bd0,&local_1c08,
                                                                                                                                                        
                                                  "oneTwoIndex.data().toString()",
                                                  "QStringLiteral(\"1,2\")",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x8df);
                                                  QString::~QString(&local_1c08);
                                                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                                                            ((QArrayDataPointer<char16_t> *)
                                                             &__range1_8);
                                                  QString::~QString(&local_1bd0);
                                                  QVariant::~QVariant(&local_1bf0);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    iVar3 = QPersistentModelIndex::column();
                                                    bVar2 = QTest::qCompare(iVar3,5,
                                                  "oneTwoIndex.column()","5",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x8e0);
                                                  if ((bVar2 & 1) != 0) {
                                                    spy_8 = (QSignalSpy *)(spyArr + 1);
                                                    __end1_8 = (QSignalSpy **)&__range1;
                                                    __begin1_8 = __end1_8;
                                                    for (; (QSignalSpy *)__end1_8 != spy_8;
                                                        __end1_8 = __end1_8 + 1) {
                                                      local_1c40 = *__end1_8;
                                                      local_1c48 = QList<QList<QVariant>_>::count
                                                                             (&local_1c40->
                                                                                                                                                              
                                                  super_QList<QList<QVariant>_>);
                                                  args_2.d.size._4_4_ = 1;
                                                  bVar1 = QTest::qCompare<long_long,int>
                                                                    (&local_1c48,
                                                                     (qint32 *)
                                                                     ((long)&args_2.d.size + 4),
                                                                     "spy->count()","1",
                                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x8e2);
                                                  if (((bVar1 ^ 0xffU) & 1) != 0) goto LAB_001505f8;
                                                  QList<QList<QVariant>_>::takeFirst
                                                            ((value_type *)local_1c68,
                                                             &local_1c40->
                                                              super_QList<QList<QVariant>_>);
                                                  pQVar4 = QList<QVariant>::at((QList<QVariant> *)
                                                                               local_1c68,0);
                                                  QVariant::value<QModelIndex>(&local_1c80,pQVar4);
                                                  bVar1 = QTest::qCompare<QModelIndex,QModelIndex>
                                                                    (&local_1c80,
                                                                     (QModelIndex *)local_558,
                                                                                                                                          
                                                  "args.at(0).value<QModelIndex>()","parIndex",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x8e4);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    pQVar4 = QList<QVariant>::at((QList<QVariant> *)
                                                                                 local_1c68,1);
                                                    iVar3 = QVariant::toInt((bool *)pQVar4);
                                                    bVar2 = QTest::qCompare(iVar3,2,
                                                  "args.at(1).toInt()","2",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x8e5);
                                                  if ((bVar2 & 1) == 0) {
                                                    bVar1 = true;
                                                  }
                                                  else {
                                                    pQVar4 = QList<QVariant>::at((QList<QVariant> *)
                                                                                 local_1c68,2);
                                                    iVar3 = QVariant::toInt((bool *)pQVar4);
                                                    bVar2 = QTest::qCompare(iVar3,2,
                                                  "args.at(2).toInt()","2",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x8e6);
                                                  if ((bVar2 & 1) == 0) {
                                                    bVar1 = true;
                                                  }
                                                  else {
                                                    pQVar4 = QList<QVariant>::at((QList<QVariant> *)
                                                                                 local_1c68,3);
                                                    QVariant::value<QModelIndex>
                                                              ((QModelIndex *)&oneOneIndex,pQVar4);
                                                    bVar1 = QTest::qCompare<QModelIndex,QModelIndex>
                                                                      ((QModelIndex *)&oneOneIndex,
                                                                       (QModelIndex *)local_558,
                                                                                                                                              
                                                  "args.at(3).value<QModelIndex>()","parIndex",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x8e7);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    pQVar4 = QList<QVariant>::at((QList<QVariant> *)
                                                                                 local_1c68,4);
                                                    iVar3 = QVariant::toInt((bool *)pQVar4);
                                                    bVar2 = QTest::qCompare(iVar3,6,
                                                  "args.at(4).toInt()","6",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x8e8);
                                                  if ((bVar2 & 1) == 0) {
                                                    bVar1 = true;
                                                  }
                                                  else {
                                                    bVar1 = false;
                                                  }
                                                  }
                                                  else {
                                                    bVar1 = true;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  else {
                                                    bVar1 = true;
                                                  }
                                                  QList<QVariant>::~QList
                                                            ((QList<QVariant> *)local_1c68);
                                                  if (bVar1) goto LAB_001505f8;
                                                  }
                                                  fillTable(this,(QAbstractItemModel *)
                                                                 &probe.field_0x8,2,6,
                                                            (QModelIndex *)local_558,0);
                                                  GenericModel::index((int)local_1cb8,
                                                                      (int)&probe + 8,
                                                                      (QModelIndex *)0x1);
                                                  QPersistentModelIndex::QPersistentModelIndex
                                                            (local_1ca0,(QModelIndex *)local_1cb8);
                                                  bVar2 = GenericModel::moveColumns
                                                                    ((QModelIndex *)&probe.field_0x8
                                                                     ,(int)local_558,0,
                                                                     (QModelIndex *)0x2,
                                                                     (int)local_558);
                                                  bVar2 = QTest::qVerify((bool)(bVar2 & 1),
                                                                                                                                                  
                                                  "testModel.moveColumns(parIndex, 0, 2, parIndex, 3)"
                                                  ,"",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x8ed);
                                                  if ((bVar2 & 1) != 0) {
                                                    GenericModel::index((int)&local_1d08,
                                                                        (int)&probe + 8,
                                                                        (QModelIndex *)0x0);
                                                    QModelIndex::data(&local_1cf0,&local_1d08,0);
                                                    QVariant::toString();
                                                    QArrayDataPointer<char16_t>::QArrayDataPointer
                                                              (&local_1d38,(Data *)0x0,L"0,2",3);
                                                    QString::QString(&local_1d20,&local_1d38);
                                                    bVar1 = QTest::qCompare(&local_1cd0,&local_1d20,
                                                                                                                                                        
                                                  "testModel.index(0, 0, parIndex).data().toString()"
                                                  ,"QStringLiteral(\"0,2\")",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x8ee);
                                                  QString::~QString(&local_1d20);
                                                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                                                            (&local_1d38);
                                                  QString::~QString(&local_1cd0);
                                                  QVariant::~QVariant(&local_1cf0);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    GenericModel::index((int)&local_1d88,
                                                                        (int)&probe + 8,
                                                                        (QModelIndex *)0x0);
                                                    QModelIndex::data(&local_1d70,&local_1d88,0);
                                                    QVariant::toString();
                                                    QArrayDataPointer<char16_t>::QArrayDataPointer
                                                              (&local_1db8,(Data *)0x0,L"0,0",3);
                                                    QString::QString(&local_1da0,&local_1db8);
                                                    bVar1 = QTest::qCompare(&local_1d50,&local_1da0,
                                                                                                                                                        
                                                  "testModel.index(0, 1, parIndex).data().toString()"
                                                  ,"QStringLiteral(\"0,0\")",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x8ef);
                                                  QString::~QString(&local_1da0);
                                                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                                                            (&local_1db8);
                                                  QString::~QString(&local_1d50);
                                                  QVariant::~QVariant(&local_1d70);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    GenericModel::index((int)&local_1e08,
                                                                        (int)&probe + 8,
                                                                        (QModelIndex *)0x0);
                                                    QModelIndex::data(&local_1df0,&local_1e08,0);
                                                    QVariant::toString();
                                                    QArrayDataPointer<char16_t>::QArrayDataPointer
                                                              (&local_1e38,(Data *)0x0,L"0,1",3);
                                                    QString::QString(&local_1e20,&local_1e38);
                                                    bVar1 = QTest::qCompare(&local_1dd0,&local_1e20,
                                                                                                                                                        
                                                  "testModel.index(0, 2, parIndex).data().toString()"
                                                  ,"QStringLiteral(\"0,1\")",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x8f0);
                                                  QString::~QString(&local_1e20);
                                                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                                                            (&local_1e38);
                                                  QString::~QString(&local_1dd0);
                                                  QVariant::~QVariant(&local_1df0);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    GenericModel::index((int)&local_1e88,
                                                                        (int)&probe + 8,
                                                                        (QModelIndex *)0x0);
                                                    QModelIndex::data(&local_1e70,&local_1e88,0);
                                                    QVariant::toString();
                                                    QArrayDataPointer<char16_t>::QArrayDataPointer
                                                              (&local_1eb8,(Data *)0x0,L"0,3",3);
                                                    QString::QString(&local_1ea0,&local_1eb8);
                                                    bVar1 = QTest::qCompare(&local_1e50,&local_1ea0,
                                                                                                                                                        
                                                  "testModel.index(0, 3, parIndex).data().toString()"
                                                  ,"QStringLiteral(\"0,3\")",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x8f1);
                                                  QString::~QString(&local_1ea0);
                                                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                                                            (&local_1eb8);
                                                  QString::~QString(&local_1e50);
                                                  QVariant::~QVariant(&local_1e70);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    GenericModel::index((int)&local_1f08,
                                                                        (int)&probe + 8,
                                                                        (QModelIndex *)0x0);
                                                    QModelIndex::data(&local_1ef0,&local_1f08,0);
                                                    QVariant::toString();
                                                    QArrayDataPointer<char16_t>::QArrayDataPointer
                                                              (&local_1f38,(Data *)0x0,L"0,4",3);
                                                    QString::QString(&local_1f20,&local_1f38);
                                                    bVar1 = QTest::qCompare(&local_1ed0,&local_1f20,
                                                                                                                                                        
                                                  "testModel.index(0, 4, parIndex).data().toString()"
                                                  ,"QStringLiteral(\"0,4\")",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x8f2);
                                                  QString::~QString(&local_1f20);
                                                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                                                            (&local_1f38);
                                                  QString::~QString(&local_1ed0);
                                                  QVariant::~QVariant(&local_1ef0);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    GenericModel::index((int)&local_1f88,
                                                                        (int)&probe + 8,
                                                                        (QModelIndex *)0x0);
                                                    QModelIndex::data(&local_1f70,&local_1f88,0);
                                                    QVariant::toString();
                                                    QArrayDataPointer<char16_t>::QArrayDataPointer
                                                              (&local_1fb8,(Data *)0x0,L"0,5",3);
                                                    QString::QString(&local_1fa0,&local_1fb8);
                                                    bVar1 = QTest::qCompare(&local_1f50,&local_1fa0,
                                                                                                                                                        
                                                  "testModel.index(0, 5, parIndex).data().toString()"
                                                  ,"QStringLiteral(\"0,5\")",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x8f3);
                                                  QString::~QString(&local_1fa0);
                                                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                                                            (&local_1fb8);
                                                  QString::~QString(&local_1f50);
                                                  QVariant::~QVariant(&local_1f70);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    GenericModel::index((int)&local_2008,
                                                                        (int)&probe + 8,
                                                                        (QModelIndex *)0x1);
                                                    QModelIndex::data(&local_1ff0,&local_2008,0);
                                                    QVariant::toString();
                                                    QArrayDataPointer<char16_t>::QArrayDataPointer
                                                              (&local_2038,(Data *)0x0,L"1,2",3);
                                                    QString::QString(&local_2020,&local_2038);
                                                    bVar1 = QTest::qCompare(&local_1fd0,&local_2020,
                                                                                                                                                        
                                                  "testModel.index(1, 0, parIndex).data().toString()"
                                                  ,"QStringLiteral(\"1,2\")",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x8f4);
                                                  QString::~QString(&local_2020);
                                                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                                                            (&local_2038);
                                                  QString::~QString(&local_1fd0);
                                                  QVariant::~QVariant(&local_1ff0);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    GenericModel::index((int)&local_2088,
                                                                        (int)&probe + 8,
                                                                        (QModelIndex *)0x1);
                                                    QModelIndex::data(&local_2070,&local_2088,0);
                                                    QVariant::toString();
                                                    QArrayDataPointer<char16_t>::QArrayDataPointer
                                                              (&local_20b8,(Data *)0x0,L"1,0",3);
                                                    QString::QString(&local_20a0,&local_20b8);
                                                    bVar1 = QTest::qCompare(&local_2050,&local_20a0,
                                                                                                                                                        
                                                  "testModel.index(1, 1, parIndex).data().toString()"
                                                  ,"QStringLiteral(\"1,0\")",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x8f5);
                                                  QString::~QString(&local_20a0);
                                                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                                                            (&local_20b8);
                                                  QString::~QString(&local_2050);
                                                  QVariant::~QVariant(&local_2070);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    GenericModel::index((int)&local_2108,
                                                                        (int)&probe + 8,
                                                                        (QModelIndex *)0x1);
                                                    QModelIndex::data(&local_20f0,&local_2108,0);
                                                    QVariant::toString();
                                                    QArrayDataPointer<char16_t>::QArrayDataPointer
                                                              (&local_2138,(Data *)0x0,L"1,1",3);
                                                    QString::QString(&local_2120,&local_2138);
                                                    bVar1 = QTest::qCompare(&local_20d0,&local_2120,
                                                                                                                                                        
                                                  "testModel.index(1, 2, parIndex).data().toString()"
                                                  ,"QStringLiteral(\"1,1\")",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x8f6);
                                                  QString::~QString(&local_2120);
                                                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                                                            (&local_2138);
                                                  QString::~QString(&local_20d0);
                                                  QVariant::~QVariant(&local_20f0);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    GenericModel::index((int)&local_2188,
                                                                        (int)&probe + 8,
                                                                        (QModelIndex *)0x1);
                                                    QModelIndex::data(&local_2170,&local_2188,0);
                                                    QVariant::toString();
                                                    QArrayDataPointer<char16_t>::QArrayDataPointer
                                                              (&local_21b8,(Data *)0x0,L"1,3",3);
                                                    QString::QString(&local_21a0,&local_21b8);
                                                    bVar1 = QTest::qCompare(&local_2150,&local_21a0,
                                                                                                                                                        
                                                  "testModel.index(1, 3, parIndex).data().toString()"
                                                  ,"QStringLiteral(\"1,3\")",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x8f7);
                                                  QString::~QString(&local_21a0);
                                                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                                                            (&local_21b8);
                                                  QString::~QString(&local_2150);
                                                  QVariant::~QVariant(&local_2170);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    GenericModel::index((int)&local_2208,
                                                                        (int)&probe + 8,
                                                                        (QModelIndex *)0x1);
                                                    QModelIndex::data(&local_21f0,&local_2208,0);
                                                    QVariant::toString();
                                                    QArrayDataPointer<char16_t>::QArrayDataPointer
                                                              (&local_2238,(Data *)0x0,L"1,4",3);
                                                    QString::QString(&local_2220,&local_2238);
                                                    bVar1 = QTest::qCompare(&local_21d0,&local_2220,
                                                                                                                                                        
                                                  "testModel.index(1, 4, parIndex).data().toString()"
                                                  ,"QStringLiteral(\"1,4\")",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x8f8);
                                                  QString::~QString(&local_2220);
                                                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                                                            (&local_2238);
                                                  QString::~QString(&local_21d0);
                                                  QVariant::~QVariant(&local_21f0);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    GenericModel::index((int)&local_2288,
                                                                        (int)&probe + 8,
                                                                        (QModelIndex *)0x1);
                                                    QModelIndex::data(&local_2270,&local_2288,0);
                                                    QVariant::toString();
                                                    QArrayDataPointer<char16_t>::QArrayDataPointer
                                                              (&local_22b8,(Data *)0x0,L"1,5",3);
                                                    QString::QString(&local_22a0,&local_22b8);
                                                    bVar1 = QTest::qCompare(&local_2250,&local_22a0,
                                                                                                                                                        
                                                  "testModel.index(1, 5, parIndex).data().toString()"
                                                  ,"QStringLiteral(\"1,5\")",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x8f9);
                                                  QString::~QString(&local_22a0);
                                                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                                                            (&local_22b8);
                                                  QString::~QString(&local_2250);
                                                  QVariant::~QVariant(&local_2270);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    QPersistentModelIndex::data((int)&local_22f0);
                                                    QVariant::toString();
                                                    QArrayDataPointer<char16_t>::QArrayDataPointer
                                                              ((QArrayDataPointer<char16_t> *)
                                                               &__range1_9,(Data *)0x0,L"1,1",3);
                                                    QString::QString(&local_2308,
                                                                     (DataPointer *)&__range1_9);
                                                    bVar1 = QTest::qCompare(&local_22d0,&local_2308,
                                                                                                                                                        
                                                  "oneOneIndex.data().toString()",
                                                  "QStringLiteral(\"1,1\")",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x8fa);
                                                  QString::~QString(&local_2308);
                                                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                                                            ((QArrayDataPointer<char16_t> *)
                                                             &__range1_9);
                                                  QString::~QString(&local_22d0);
                                                  QVariant::~QVariant(&local_22f0);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    iVar3 = QPersistentModelIndex::column();
                                                    bVar2 = QTest::qCompare(iVar3,2,
                                                  "oneOneIndex.column()","2",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x8fb);
                                                  if ((bVar2 & 1) != 0) {
                                                    spy_9 = (QSignalSpy *)(spyArr + 1);
                                                    __end1_9 = (QSignalSpy **)&__range1;
                                                    __begin1_9 = __end1_9;
                                                    for (; (QSignalSpy *)__end1_9 != spy_9;
                                                        __end1_9 = __end1_9 + 1) {
                                                      local_2340 = *__end1_9;
                                                      local_2348 = QList<QList<QVariant>_>::count
                                                                             (&local_2340->
                                                                                                                                                              
                                                  super_QList<QList<QVariant>_>);
                                                  args_3.d.size._4_4_ = 1;
                                                  bVar1 = QTest::qCompare<long_long,int>
                                                                    (&local_2348,
                                                                     (qint32 *)
                                                                     ((long)&args_3.d.size + 4),
                                                                     "spy->count()","1",
                                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x8fd);
                                                  if (((bVar1 ^ 0xffU) & 1) != 0) break;
                                                  QList<QList<QVariant>_>::takeFirst
                                                            ((value_type *)local_2368,
                                                             &local_2340->
                                                              super_QList<QList<QVariant>_>);
                                                  pQVar4 = QList<QVariant>::at((QList<QVariant> *)
                                                                               local_2368,0);
                                                  QVariant::value<QModelIndex>(&local_2380,pQVar4);
                                                  bVar1 = QTest::qCompare<QModelIndex,QModelIndex>
                                                                    (&local_2380,
                                                                     (QModelIndex *)local_558,
                                                                                                                                          
                                                  "args.at(0).value<QModelIndex>()","parIndex",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x8ff);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    pQVar4 = QList<QVariant>::at((QList<QVariant> *)
                                                                                 local_2368,1);
                                                    iVar3 = QVariant::toInt((bool *)pQVar4);
                                                    bVar2 = QTest::qCompare(iVar3,0,
                                                  "args.at(1).toInt()","0",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x900);
                                                  if ((bVar2 & 1) == 0) {
                                                    bVar1 = true;
                                                  }
                                                  else {
                                                    pQVar4 = QList<QVariant>::at((QList<QVariant> *)
                                                                                 local_2368,2);
                                                    iVar3 = QVariant::toInt((bool *)pQVar4);
                                                    bVar2 = QTest::qCompare(iVar3,1,
                                                  "args.at(2).toInt()","1",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x901);
                                                  if ((bVar2 & 1) == 0) {
                                                    bVar1 = true;
                                                  }
                                                  else {
                                                    pQVar4 = QList<QVariant>::at((QList<QVariant> *)
                                                                                 local_2368,3);
                                                    QVariant::value<QModelIndex>(&local_2398,pQVar4)
                                                    ;
                                                    bVar1 = QTest::qCompare<QModelIndex,QModelIndex>
                                                                      (&local_2398,
                                                                       (QModelIndex *)local_558,
                                                                                                                                              
                                                  "args.at(3).value<QModelIndex>()","parIndex",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x902);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    pQVar4 = QList<QVariant>::at((QList<QVariant> *)
                                                                                 local_2368,4);
                                                    iVar3 = QVariant::toInt((bool *)pQVar4);
                                                    bVar2 = QTest::qCompare(iVar3,3,
                                                  "args.at(4).toInt()","3",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x903);
                                                  if ((bVar2 & 1) == 0) {
                                                    bVar1 = true;
                                                  }
                                                  else {
                                                    bVar1 = false;
                                                  }
                                                  }
                                                  else {
                                                    bVar1 = true;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  else {
                                                    bVar1 = true;
                                                  }
                                                  QList<QVariant>::~QList
                                                            ((QList<QVariant> *)local_2368);
                                                  if (bVar1) break;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  QPersistentModelIndex::~QPersistentModelIndex
                                                            (local_1ca0);
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
LAB_001505f8:
                  QPersistentModelIndex::~QPersistentModelIndex(local_7b0);
                }
              }
            }
          }
        }
      }
    }
LAB_00150604:
    QSignalSpy::~QSignalSpy((QSignalSpy *)(spyArr + 1));
  }
  QSignalSpy::~QSignalSpy((QSignalSpy *)local_5f0);
  ModelTest::~ModelTest((ModelTest *)local_518);
  GenericModel::~GenericModel((GenericModel *)&probe.field_0x8);
  return;
}

Assistant:

void tst_GenericModel::moveColumnsTreeSameBranch()
{
    GenericModel testModel;
    ModelTest probe(&testModel, nullptr);
    fillTable(&testModel, 2, 6);
    const QModelIndex parIndex = testModel.index(1, 0);
    fillTable(&testModel, 2, 6, parIndex);
    QSignalSpy rowsAboutToBeMovedSpy(&testModel, SIGNAL(columnsAboutToBeMoved(QModelIndex, int, int, QModelIndex, int)));
    QVERIFY(rowsAboutToBeMovedSpy.isValid());
    QSignalSpy columnsMovedSpy(&testModel, SIGNAL(columnsMoved(QModelIndex, int, int, QModelIndex, int)));
    QVERIFY(columnsMovedSpy.isValid());
    QSignalSpy *spyArr[] = {&rowsAboutToBeMovedSpy, &columnsMovedSpy};

    QVERIFY(!testModel.moveColumns(parIndex, 2, 1, parIndex, -1));
    for (QSignalSpy *spy : spyArr)
        QCOMPARE(spy->count(), 0);
    QVERIFY(!testModel.moveColumns(parIndex, 2, 1, parIndex, 7));
    for (QSignalSpy *spy : spyArr)
        QCOMPARE(spy->count(), 0);
    QVERIFY(!testModel.moveColumns(parIndex, -1, 1, parIndex, 3));
    for (QSignalSpy *spy : spyArr)
        QCOMPARE(spy->count(), 0);
    QVERIFY(!testModel.moveColumns(parIndex, 6, 1, parIndex, 3));
    for (QSignalSpy *spy : spyArr)
        QCOMPARE(spy->count(), 0);
    QVERIFY(!testModel.moveColumns(parIndex, 1, 2, parIndex, 2));
    for (QSignalSpy *spy : spyArr)
        QCOMPARE(spy->count(), 0);
    QVERIFY(!testModel.moveColumns(parIndex, 1, 2, parIndex, 3));
    for (QSignalSpy *spy : spyArr)
        QCOMPARE(spy->count(), 0);

    QPersistentModelIndex oneTwoIndex = testModel.index(1, 2, parIndex);
    QVERIFY(testModel.moveColumns(parIndex, 2, 1, parIndex, 4));
    QCOMPARE(testModel.index(0, 0, parIndex).data().toString(), QStringLiteral("0,0"));
    QCOMPARE(testModel.index(0, 1, parIndex).data().toString(), QStringLiteral("0,1"));
    QCOMPARE(testModel.index(0, 2, parIndex).data().toString(), QStringLiteral("0,3"));
    QCOMPARE(testModel.index(0, 3, parIndex).data().toString(), QStringLiteral("0,2"));
    QCOMPARE(testModel.index(0, 4, parIndex).data().toString(), QStringLiteral("0,4"));
    QCOMPARE(testModel.index(0, 5, parIndex).data().toString(), QStringLiteral("0,5"));
    QCOMPARE(testModel.index(1, 0, parIndex).data().toString(), QStringLiteral("1,0"));
    QCOMPARE(testModel.index(1, 1, parIndex).data().toString(), QStringLiteral("1,1"));
    QCOMPARE(testModel.index(1, 2, parIndex).data().toString(), QStringLiteral("1,3"));
    QCOMPARE(testModel.index(1, 3, parIndex).data().toString(), QStringLiteral("1,2"));
    QCOMPARE(testModel.index(1, 4, parIndex).data().toString(), QStringLiteral("1,4"));
    QCOMPARE(testModel.index(1, 5, parIndex).data().toString(), QStringLiteral("1,5"));
    QCOMPARE(oneTwoIndex.data().toString(), QStringLiteral("1,2"));
    QCOMPARE(oneTwoIndex.column(), 3);
    for (QSignalSpy *spy : spyArr) {
        QCOMPARE(spy->count(), 1);
        const auto args = spy->takeFirst();
        QCOMPARE(args.at(0).value<QModelIndex>(), parIndex);
        QCOMPARE(args.at(1).toInt(), 2);
        QCOMPARE(args.at(2).toInt(), 2);
        QCOMPARE(args.at(3).value<QModelIndex>(), parIndex);
        QCOMPARE(args.at(4).toInt(), 4);
    }

    fillTable(&testModel, 2, 6, parIndex);
    oneTwoIndex = testModel.index(1, 2, parIndex);
    QVERIFY(testModel.moveColumns(parIndex, 2, 1, parIndex, 0));
    QCOMPARE(testModel.index(0, 0, parIndex).data().toString(), QStringLiteral("0,2"));
    QCOMPARE(testModel.index(0, 1, parIndex).data().toString(), QStringLiteral("0,0"));
    QCOMPARE(testModel.index(0, 2, parIndex).data().toString(), QStringLiteral("0,1"));
    QCOMPARE(testModel.index(0, 3, parIndex).data().toString(), QStringLiteral("0,3"));
    QCOMPARE(testModel.index(0, 4, parIndex).data().toString(), QStringLiteral("0,4"));
    QCOMPARE(testModel.index(0, 5, parIndex).data().toString(), QStringLiteral("0,5"));
    QCOMPARE(testModel.index(1, 0, parIndex).data().toString(), QStringLiteral("1,2"));
    QCOMPARE(testModel.index(1, 1, parIndex).data().toString(), QStringLiteral("1,0"));
    QCOMPARE(testModel.index(1, 2, parIndex).data().toString(), QStringLiteral("1,1"));
    QCOMPARE(testModel.index(1, 3, parIndex).data().toString(), QStringLiteral("1,3"));
    QCOMPARE(testModel.index(1, 4, parIndex).data().toString(), QStringLiteral("1,4"));
    QCOMPARE(testModel.index(1, 5, parIndex).data().toString(), QStringLiteral("1,5"));
    QCOMPARE(oneTwoIndex.data().toString(), QStringLiteral("1,2"));
    QCOMPARE(oneTwoIndex.column(), 0);
    for (QSignalSpy *spy : spyArr) {
        QCOMPARE(spy->count(), 1);
        const auto args = spy->takeFirst();
        QCOMPARE(args.at(0).value<QModelIndex>(), parIndex);
        QCOMPARE(args.at(1).toInt(), 2);
        QCOMPARE(args.at(2).toInt(), 2);
        QCOMPARE(args.at(3).value<QModelIndex>(), parIndex);
        QCOMPARE(args.at(4).toInt(), 0);
    }

    fillTable(&testModel, 2, 6, parIndex);
    oneTwoIndex = testModel.index(1, 2, parIndex);
    QVERIFY(testModel.moveColumns(parIndex, 2, 1, parIndex, 6));
    QCOMPARE(testModel.index(0, 0, parIndex).data().toString(), QStringLiteral("0,0"));
    QCOMPARE(testModel.index(0, 1, parIndex).data().toString(), QStringLiteral("0,1"));
    QCOMPARE(testModel.index(0, 2, parIndex).data().toString(), QStringLiteral("0,3"));
    QCOMPARE(testModel.index(0, 3, parIndex).data().toString(), QStringLiteral("0,4"));
    QCOMPARE(testModel.index(0, 4, parIndex).data().toString(), QStringLiteral("0,5"));
    QCOMPARE(testModel.index(0, 5, parIndex).data().toString(), QStringLiteral("0,2"));
    QCOMPARE(testModel.index(1, 0, parIndex).data().toString(), QStringLiteral("1,0"));
    QCOMPARE(testModel.index(1, 1, parIndex).data().toString(), QStringLiteral("1,1"));
    QCOMPARE(testModel.index(1, 2, parIndex).data().toString(), QStringLiteral("1,3"));
    QCOMPARE(testModel.index(1, 3, parIndex).data().toString(), QStringLiteral("1,4"));
    QCOMPARE(testModel.index(1, 4, parIndex).data().toString(), QStringLiteral("1,5"));
    QCOMPARE(testModel.index(1, 5, parIndex).data().toString(), QStringLiteral("1,2"));
    QCOMPARE(oneTwoIndex.data().toString(), QStringLiteral("1,2"));
    QCOMPARE(oneTwoIndex.column(), 5);
    for (QSignalSpy *spy : spyArr) {
        QCOMPARE(spy->count(), 1);
        const auto args = spy->takeFirst();
        QCOMPARE(args.at(0).value<QModelIndex>(), parIndex);
        QCOMPARE(args.at(1).toInt(), 2);
        QCOMPARE(args.at(2).toInt(), 2);
        QCOMPARE(args.at(3).value<QModelIndex>(), parIndex);
        QCOMPARE(args.at(4).toInt(), 6);
    }

    fillTable(&testModel, 2, 6, parIndex);
    QPersistentModelIndex oneOneIndex = testModel.index(1, 1, parIndex);
    QVERIFY(testModel.moveColumns(parIndex, 0, 2, parIndex, 3));
    QCOMPARE(testModel.index(0, 0, parIndex).data().toString(), QStringLiteral("0,2"));
    QCOMPARE(testModel.index(0, 1, parIndex).data().toString(), QStringLiteral("0,0"));
    QCOMPARE(testModel.index(0, 2, parIndex).data().toString(), QStringLiteral("0,1"));
    QCOMPARE(testModel.index(0, 3, parIndex).data().toString(), QStringLiteral("0,3"));
    QCOMPARE(testModel.index(0, 4, parIndex).data().toString(), QStringLiteral("0,4"));
    QCOMPARE(testModel.index(0, 5, parIndex).data().toString(), QStringLiteral("0,5"));
    QCOMPARE(testModel.index(1, 0, parIndex).data().toString(), QStringLiteral("1,2"));
    QCOMPARE(testModel.index(1, 1, parIndex).data().toString(), QStringLiteral("1,0"));
    QCOMPARE(testModel.index(1, 2, parIndex).data().toString(), QStringLiteral("1,1"));
    QCOMPARE(testModel.index(1, 3, parIndex).data().toString(), QStringLiteral("1,3"));
    QCOMPARE(testModel.index(1, 4, parIndex).data().toString(), QStringLiteral("1,4"));
    QCOMPARE(testModel.index(1, 5, parIndex).data().toString(), QStringLiteral("1,5"));
    QCOMPARE(oneOneIndex.data().toString(), QStringLiteral("1,1"));
    QCOMPARE(oneOneIndex.column(), 2);
    for (QSignalSpy *spy : spyArr) {
        QCOMPARE(spy->count(), 1);
        const auto args = spy->takeFirst();
        QCOMPARE(args.at(0).value<QModelIndex>(), parIndex);
        QCOMPARE(args.at(1).toInt(), 0);
        QCOMPARE(args.at(2).toInt(), 1);
        QCOMPARE(args.at(3).value<QModelIndex>(), parIndex);
        QCOMPARE(args.at(4).toInt(), 3);
    }
}